

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O3

void GPU_Vector4ApplyMatrix(float *vec4,float *matrix_4x4)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  
  fVar6 = *vec4;
  fVar1 = vec4[1];
  fVar2 = vec4[2];
  fVar3 = vec4[3];
  auVar7._0_8_ = CONCAT44((float)((ulong)*(undefined8 *)(matrix_4x4 + 0xc) >> 0x20) * fVar3 +
                          (float)((ulong)*(undefined8 *)(matrix_4x4 + 8) >> 0x20) * fVar2 +
                          (float)((ulong)*(undefined8 *)matrix_4x4 >> 0x20) * fVar6 +
                          (float)((ulong)*(undefined8 *)(matrix_4x4 + 4) >> 0x20) * fVar1,
                          (float)*(undefined8 *)(matrix_4x4 + 0xc) * fVar3 +
                          (float)*(undefined8 *)(matrix_4x4 + 8) * fVar2 +
                          (float)*(undefined8 *)matrix_4x4 * fVar6 +
                          (float)*(undefined8 *)(matrix_4x4 + 4) * fVar1);
  auVar7._8_4_ = fVar3 * 0.0 + fVar2 * 0.0 + fVar6 * 0.0 + fVar1 * 0.0;
  auVar7._12_4_ = fVar3 * 0.0 + fVar2 * 0.0 + fVar6 * 0.0 + fVar1 * 0.0;
  fVar5 = (float)*(undefined8 *)(matrix_4x4 + 0xe) * fVar3 +
          (float)*(undefined8 *)(matrix_4x4 + 10) * fVar2 +
          fVar6 * (float)*(undefined8 *)(matrix_4x4 + 2) +
          (float)*(undefined8 *)(matrix_4x4 + 6) * fVar1;
  fVar6 = (float)((ulong)*(undefined8 *)(matrix_4x4 + 0xe) >> 0x20) * fVar3 +
          (float)((ulong)*(undefined8 *)(matrix_4x4 + 10) >> 0x20) * fVar2 +
          fVar6 * (float)((ulong)*(undefined8 *)(matrix_4x4 + 2) >> 0x20) +
          (float)((ulong)*(undefined8 *)(matrix_4x4 + 6) >> 0x20) * fVar1;
  *(undefined8 *)vec4 = auVar7._0_8_;
  *(ulong *)(vec4 + 2) = CONCAT44(fVar6,fVar5);
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    auVar4._4_4_ = fVar6;
    auVar4._0_4_ = fVar6;
    auVar4._8_4_ = fVar6;
    auVar4._12_4_ = fVar6;
    auVar7 = divps(auVar7,auVar4);
    *(long *)vec4 = auVar7._0_8_;
    vec4[2] = fVar5 / fVar6;
    vec4[3] = 1.0;
  }
  return;
}

Assistant:

void GPU_Vector4ApplyMatrix(float* vec4, const float* matrix_4x4)
{
	float x = matrix_4x4[0] * vec4[0] + matrix_4x4[4] * vec4[1] + matrix_4x4[8] * vec4[2] + matrix_4x4[12] * vec4[3];
	float y = matrix_4x4[1] * vec4[0] + matrix_4x4[5] * vec4[1] + matrix_4x4[9] * vec4[2] + matrix_4x4[13] * vec4[3];
	float z = matrix_4x4[2] * vec4[0] + matrix_4x4[6] * vec4[1] + matrix_4x4[10] * vec4[2] + matrix_4x4[14] * vec4[3];
	float w = matrix_4x4[3] * vec4[0] + matrix_4x4[7] * vec4[1] + matrix_4x4[11] * vec4[2] + matrix_4x4[15] * vec4[3];
	
    vec4[0] = x;
    vec4[1] = y;
    vec4[2] = z;
    vec4[3] = w;
	if(w != 0.0f)
    {
        vec4[0] = x / w;
        vec4[1] = y / w;
        vec4[2] = z / w;
        vec4[3] = 1;
    }
}